

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

errr finish_parse_ui_entry_renderer(parser *p)

{
  char *name;
  renderer_info *prVar1;
  wchar_t wVar2;
  int iVar3;
  size_t sVar4;
  void *__dest;
  long lVar5;
  long lVar6;
  long lVar7;
  wchar_t defsym [64];
  wchar_t local_138 [66];
  
  if (L'\0' < renderer_count) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      prVar1 = renderers;
      name = *(char **)((long)&renderers->comb_rend_nm + lVar7);
      if (name != (char *)0x0) {
        wVar2 = ui_entry_renderer_lookup(name);
        *(wchar_t *)((long)&prVar1->combined_renderer_index + lVar7) = wVar2;
        string_free(name);
        *(undefined8 *)((long)&renderers->comb_rend_nm + lVar7) = 0;
      }
      lVar5 = *(long *)((long)&renderers->backend + lVar7);
      if (lVar5 != 0) {
        if (*(int *)((long)&renderers->combiner_index + lVar7) == 0) {
          iVar3 = ui_entry_combiner_lookup(*(char **)(lVar5 + 0x10));
          *(int *)((long)&renderers->combiner_index + lVar7) = iVar3;
          if (iVar3 == 0) {
            __assert_fail("renderers[i].combiner_index != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-entry-renderers.c"
                          ,0x671,"errr finish_parse_ui_entry_renderer(struct parser *)");
          }
        }
        augment_colors(*(char **)(*(long *)((long)&renderers->backend + lVar7) + 0x18),
                       (int **)((long)&renderers->colors + lVar7),
                       (int *)((long)&renderers->ncolors + lVar7));
        augment_colors(*(char **)(*(long *)((long)&renderers->backend + lVar7) + 0x20),
                       (int **)((long)&renderers->label_colors + lVar7),
                       (int *)((long)&renderers->nlabcolors + lVar7));
        prVar1 = renderers;
        sVar4 = text_mbstowcs(local_138,
                              *(char **)(*(long *)((long)&renderers->backend + lVar7) + 0x28),L'@');
        if (sVar4 == 0xffffffffffffffff) {
          quit("Invalid encoding for default symbols");
        }
        iVar3 = (int)sVar4;
        if (*(int *)((long)&prVar1->nsym + lVar7) < iVar3) {
          __dest = mem_alloc(sVar4 * 4 + 4);
          lVar5 = (long)*(int *)((long)&prVar1->nsym + lVar7);
          if (0 < lVar5) {
            memcpy(__dest,*(void **)((long)&prVar1->symbols + lVar7),lVar5 << 2);
          }
          mem_free(*(void **)((long)&prVar1->symbols + lVar7));
          lVar5 = (long)*(int *)((long)&prVar1->nsym + lVar7);
          memcpy((void *)(lVar5 * 4 + (long)__dest),local_138 + lVar5,(iVar3 - lVar5) * 4);
          sVar4 = text_mbstowcs((wchar_t *)(sVar4 * 4 + (long)__dest),"",L'\x01');
          if (sVar4 == 0xffffffffffffffff) {
            quit("Couldn\'t terminate null character string");
          }
          *(int *)((long)&prVar1->nsym + lVar7) = iVar3;
          *(void **)((long)&prVar1->symbols + lVar7) = __dest;
        }
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x58;
    } while (lVar6 < renderer_count);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_ui_entry_renderer(struct parser *p)
{
	int i;

	for (i = 0; i < renderer_count; ++i) {
		/* Get the combined value renderer. */
		if (renderers[i].comb_rend_nm) {
			renderers[i].combined_renderer_index =
				ui_entry_renderer_lookup(renderers[i].comb_rend_nm);
			string_free(renderers[i].comb_rend_nm);
			renderers[i].comb_rend_nm = NULL;
		}

		if (!renderers[i].backend) {
			continue;
		}

		/* Use the default combiner if nothing was set. */
		if (!renderers[i].combiner_index) {
			renderers[i].combiner_index = ui_entry_combiner_lookup(
				renderers[i].backend->default_combiner_name);
			assert(renderers[i].combiner_index != 0);
		}

		/*
		 * If have fewer colors or symbols than the defaults for the
		 * backend, augment what was set with the default values.
		 */
		augment_colors(renderers[i].backend->default_colors,
			&renderers[i].colors, &renderers[i].ncolors);
		augment_colors(renderers[i].backend->default_labelcolors,
			&renderers[i].label_colors, &renderers[i].nlabcolors);
		augment_symbols(renderers[i].backend->default_symbols,
			&renderers[i].symbols, &renderers[i].nsym);

		if (renderers[i].ndigit == INT_MIN) {
			renderers[i].ndigit =
				renderers[i].backend->default_ndigit;
		}
		if (renderers[i].sign == UI_ENTRY_SIGN_DEFAULT) {
			renderers[i].sign =
				renderers[i].backend->default_sign;
		}
	}
	parser_destroy(p);
	return 0;
}